

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDComponentPtrPair __thiscall ON_SubDFace::VertexEdgePair(ON_SubDFace *this,uint vertex_index)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  ulong uVar3;
  ulong uVar4;
  ON_SubDEdgePtr *pOVar5;
  bool bVar6;
  undefined8 in_RAX;
  undefined7 uVar8;
  ON_SubDComponentPtr OVar7;
  undefined8 in_RDX;
  undefined7 uVar10;
  ON_SubDComponentPtr OVar9;
  ON__UINT_PTR OVar11;
  uint uVar12;
  ON__UINT_PTR OVar13;
  bool bVar14;
  ON_SubDComponentPtrPair OVar15;
  
  uVar1 = this->m_edge_count;
  uVar12 = (uint)uVar1;
  bVar14 = uVar12 < 3;
  uVar8 = (undefined7)((ulong)in_RAX >> 8);
  OVar7.m_ptr = CONCAT71(uVar8,bVar14);
  uVar10 = (undefined7)((ulong)in_RDX >> 8);
  bVar6 = true;
  OVar9.m_ptr = CONCAT71(uVar10,uVar12 <= vertex_index || bVar14);
  if (uVar12 > vertex_index && !bVar14) {
    OVar7.m_ptr = CONCAT71(uVar8,4 < uVar1);
    pOVar2 = this->m_edgex;
    OVar9.m_ptr = CONCAT71(uVar10,pOVar2 == (ON_SubDEdgePtr *)0x0);
    if (4 >= uVar1 || pOVar2 != (ON_SubDEdgePtr *)0x0) {
      OVar13 = 0;
      uVar12 = ((vertex_index + uVar1) - 1) % (uint)uVar1;
      pOVar5 = pOVar2 + -4;
      if (uVar12 < 4) {
        pOVar5 = this->m_edge4;
      }
      uVar3 = *(ulong *)((long)&pOVar5->m_ptr + (ulong)(uVar12 * 8));
      OVar7.m_ptr = (ON__UINT_PTR)(pOVar2 + (long)(int)vertex_index + -4);
      if (vertex_index < 4) {
        OVar7.m_ptr = (ON__UINT_PTR)(this->m_edge4 + vertex_index);
      }
      OVar9.m_ptr = uVar3 & 0xfffffffffffffff8;
      if ((ON_SubDEdgePtr *)OVar9.m_ptr != (ON_SubDEdgePtr *)0x0) {
        OVar13 = ((ON_SubDEdgePtr *)(OVar9.m_ptr + ((ulong)(~(uint)uVar3 & 1) + 0x10) * 8))->m_ptr;
      }
      if (OVar13 != 0) {
        uVar4 = ((ON_SubDEdgePtr *)OVar7.m_ptr)->m_ptr;
        OVar7.m_ptr = uVar4 & 0xfffffffffffffff8;
        if ((ON_SubDEdgePtr *)OVar7.m_ptr == (ON_SubDEdgePtr *)0x0) {
          OVar11 = 0;
        }
        else {
          OVar9.m_ptr = (ON__UINT_PTR)((uint)uVar4 & 1);
          OVar11 = ((ON_SubDEdgePtr *)(OVar7.m_ptr + (ON_SubDEdgePtr *)(OVar9.m_ptr + 0x10) * 8))->
                   m_ptr;
        }
        if (OVar13 == OVar11) {
          OVar7.m_ptr = (ON__UINT_PTR)(uVar3 & 0xfffffffffffffff9 | 4);
          if (uVar3 < 8) {
            OVar7.m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr *)0;
          }
          OVar9.m_ptr = (ON__UINT_PTR)(uVar4 & 0xfffffffffffffff9 | 4);
          if (uVar4 < 8) {
            OVar9.m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr *)0;
          }
          bVar6 = false;
        }
      }
    }
  }
  if (bVar6) {
    OVar7.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
    OVar9.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  }
  OVar15.m_pair[1].m_ptr = OVar9.m_ptr;
  OVar15.m_pair[0].m_ptr = OVar7.m_ptr;
  return (ON_SubDComponentPtrPair)OVar15.m_pair;
}

Assistant:

const ON_SubDComponentPtrPair ON_SubDFace::VertexEdgePair(
  unsigned vertex_index
) const
{
  for (;;)
  {
    const unsigned edge_count = m_edge_count;
    if (edge_count < 3)
      break;
    if (vertex_index >= edge_count)
      break;
    if (edge_count > 4 && nullptr == m_edgex)
      break;
    const unsigned fei0 = (vertex_index + (edge_count - 1)) % edge_count;
    const ON_SubDEdgePtr eptr[2] =
    {
      (fei0 < 4 ? m_edge4[fei0] : m_edgex[fei0 - 4]),
      (vertex_index < 4 ? m_edge4[vertex_index] : m_edgex[vertex_index - 4]),
    };
    const ON_SubDVertex* v = eptr[0].RelativeVertex(1);
    if (nullptr == v || v != eptr[1].RelativeVertex(0))
      break;
    return ON_SubDComponentPtrPair::Create( ON_SubDComponentPtr::Create(eptr[0]), ON_SubDComponentPtr::Create(eptr[1]) );
  }
  return ON_SubDComponentPtrPair::Null;
}